

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int loop_licm(gen_ctx_t gen_ctx,loop_node_t_conflict loop)

{
  bitmap_t bm;
  bitmap_t bm_00;
  VARR_bb_insn_t *varr;
  bb_t_conflict to;
  bool bVar1;
  bool bVar2;
  loop_node_t_conflict bb_insn_00;
  loop_node_t_conflict gen_ctx_00;
  int iVar3;
  size_t sVar4;
  bb_insn_t_conflict before;
  char *pcVar5;
  ulong local_a8;
  size_t i_2;
  int input_var_p;
  int can_be_moved;
  int i_1;
  size_t i;
  VARR_bb_insn_t *loop_invariant_bb_insns;
  bitmap_t bb_insns_to_move_bitmap;
  bitmap_t loop_invariant_bb_insn_bitmap;
  insn_var_iterator_t iter;
  ssa_edge_t_conflict se;
  MIR_reg_t var;
  int op_num;
  int move_p;
  int subloop_p;
  loop_node_t_conflict node;
  bb_insn_t_conflict bb_insn;
  MIR_insn_t insn;
  loop_node_t_conflict loop_local;
  gen_ctx_t gen_ctx_local;
  
  op_num = 0;
  var = 0;
  bm = gen_ctx->temp_bitmap;
  bm_00 = gen_ctx->temp_bitmap2;
  varr = gen_ctx->temp_bb_insns;
  insn = (MIR_insn_t)loop;
  loop_local = (loop_node_t_conflict)gen_ctx;
  for (_move_p = DLIST_loop_node_t_head(&loop->children); _move_p != (loop_node_t_conflict)0x0;
      _move_p = DLIST_loop_node_t_next(_move_p)) {
    if (_move_p->bb == (bb_t)0x0) {
      op_num = 1;
      iVar3 = loop_licm((gen_ctx_t)loop_local,_move_p);
      if (iVar3 != 0) {
        var = 1;
      }
    }
  }
  if (((op_num == 0) && (((loop_local[3].parent)->children).head != (loop_node_t)insn)) &&
     (insn->ops[0].data != (void *)0x0)) {
    if ((loop_local->parent != (loop_node_t)0x0) && (1 < *(int *)&loop_local->u)) {
      fprintf((FILE *)loop_local->parent,"Processing Loop%3lu for loop invariant motion:\n",
              (ulong)*(uint *)&insn->data);
    }
    VARR_bb_insn_ttrunc(varr,0);
    bitmap_clear(bm);
    for (_move_p = DLIST_loop_node_t_head((DLIST_loop_node_t *)&insn->ops[0].field_0x8);
        _move_p != (loop_node_t_conflict)0x0; _move_p = DLIST_loop_node_t_next(_move_p)) {
      if (_move_p->bb != (bb_t)0x0) {
        for (node = (loop_node_t_conflict)DLIST_bb_insn_t_head(&_move_p->bb->bb_insns);
            node != (loop_node_t_conflict)0x0;
            node = (loop_node_t_conflict)DLIST_bb_insn_t_next((bb_insn_t_conflict)node)) {
          iVar3 = loop_invariant_p((gen_ctx_t)loop_local,(loop_node_t_conflict)insn,
                                   (bb_insn_t_conflict)node,(bitmap_t)0x0);
          if (iVar3 != 0) {
            VARR_bb_insn_tpush(varr,(bb_insn_t_conflict)node);
            bitmap_set_bit_p(bm,(ulong)*(uint *)((long)&node->bb + 4));
          }
        }
      }
    }
    for (_can_be_moved = 0; sVar4 = VARR_bb_insn_tlength(varr), _can_be_moved < sVar4;
        _can_be_moved = _can_be_moved + 1) {
      node = (loop_node_t_conflict)VARR_bb_insn_tget(varr,_can_be_moved);
      bb_insn = (bb_insn_t_conflict)((bb_insn_t_conflict)node)->insn;
      insn_var_iterator_init
                ((insn_var_iterator_t *)&loop_invariant_bb_insn_bitmap,(MIR_insn_t)bb_insn);
      while (iVar3 = output_insn_var_iterator_next
                               ((gen_ctx_t)loop_local,
                                (insn_var_iterator_t *)&loop_invariant_bb_insn_bitmap,
                                (MIR_reg_t *)&se,(int *)((long)&se + 4)), iVar3 != 0) {
        for (iter.op_part_num = (size_t)(&bb_insn->bb_insn_link)[(long)se._4_4_ * 3].prev;
            iter.op_part_num != 0; iter.op_part_num = *(size_t *)(iter.op_part_num + 0x20)) {
          iVar3 = loop_invariant_p((gen_ctx_t)loop_local,(loop_node_t_conflict)insn,
                                   *(bb_insn_t_conflict *)iter.op_part_num,bm);
          if ((iVar3 != 0) &&
             (iVar3 = bitmap_set_bit_p(bm,(ulong)*(uint *)(*(long *)iter.op_part_num + 0xc)),
             iVar3 != 0)) {
            VARR_bb_insn_tpush(varr,*(bb_insn_t_conflict *)iter.op_part_num);
          }
        }
      }
    }
    bitmap_clear(bm_00);
    sVar4 = VARR_bb_insn_tlength(varr);
    input_var_p = (int)sVar4;
    while (input_var_p = input_var_p + -1, -1 < input_var_p) {
      node = (loop_node_t_conflict)VARR_bb_insn_tget(varr,(long)input_var_p);
      bb_insn = (bb_insn_t_conflict)((bb_insn_t_conflict)node)->insn;
      if ((loop_local->parent != (loop_node_t)0x0) && (1 < *(int *)&loop_local->u)) {
        fprintf((FILE *)loop_local->parent,"  Considering invariant ");
        print_bb_insn((gen_ctx_t)loop_local,(bb_insn_t_conflict)node,0);
      }
      iVar3 = bitmap_bit_p(bm_00,(ulong)*(uint *)((long)&node->bb + 4));
      if (iVar3 == 0) {
        iVar3 = expensive_insn_p((MIR_insn_t)bb_insn);
        if (iVar3 == 0) {
          bVar2 = true;
          bVar1 = false;
          insn_var_iterator_init
                    ((insn_var_iterator_t *)&loop_invariant_bb_insn_bitmap,(MIR_insn_t)bb_insn);
          do {
            iVar3 = input_insn_var_iterator_next
                              ((gen_ctx_t)loop_local,
                               (insn_var_iterator_t *)&loop_invariant_bb_insn_bitmap,
                               (MIR_reg_t *)&se,(int *)((long)&se + 4));
            if (iVar3 == 0) goto LAB_00153d21;
            bVar1 = true;
            iter.op_part_num = (size_t)(&bb_insn->bb_insn_link)[(long)se._4_4_ * 3].prev;
          } while (((((bb_insn_t)iter.op_part_num == (bb_insn_t)0x0) ||
                    (iVar3 = bitmap_bit_p(bm,(ulong)*(uint *)(*(long *)&((bb_insn_t)iter.op_part_num
                                                                        )->gvn_val_const_p + 0xc)),
                    iVar3 == 0)) ||
                   (iVar3 = bitmap_bit_p(bm_00,(ulong)*(uint *)(*(long *)(iter.op_part_num + 8) +
                                                               0xc)), iVar3 != 0)) ||
                  (iVar3 = non_invariant_use_p((gen_ctx_t)loop_local,
                                               *(bb_insn_t_conflict *)(iter.op_part_num + 8),bm),
                  iVar3 == 0));
          bVar2 = false;
LAB_00153d21:
          if ((loop_local->parent != (loop_node_t)0x0) && (1 < *(int *)&loop_local->u)) {
            if (bVar1) {
              pcVar5 = "can\'t";
              if (bVar2) {
                pcVar5 = "can";
              }
              fprintf((FILE *)loop_local->parent,
                      "     -- %s be moved because reg presure consideration\n",pcVar5);
            }
            else {
              fprintf((FILE *)loop_local->parent,"     -- can\'t be moved because single insn\n");
            }
          }
          if ((bVar2) && (bVar1)) {
            mark_as_moved((gen_ctx_t)loop_local,(bb_insn_t_conflict)node,bm,bm_00);
          }
        }
        else {
          if ((loop_local->parent != (loop_node_t)0x0) && (1 < *(int *)&loop_local->u)) {
            fprintf((FILE *)loop_local->parent,"     -- marked as moved becuase it is costly\n");
          }
          mark_as_moved((gen_ctx_t)loop_local,(bb_insn_t_conflict)node,bm,bm_00);
        }
      }
      else if ((loop_local->parent != (loop_node_t)0x0) && (1 < *(int *)&loop_local->u)) {
        fprintf((FILE *)loop_local->parent,"     -- already marked as moved\n");
      }
    }
    for (local_a8 = 0; sVar4 = VARR_bb_insn_tlength(varr), local_a8 < sVar4; local_a8 = local_a8 + 1
        ) {
      node = (loop_node_t_conflict)VARR_bb_insn_tget(varr,local_a8);
      iVar3 = bitmap_bit_p(bm_00,(ulong)((bb_insn_t_conflict)node)->index);
      if (iVar3 != 0) {
        bb_insn = *(bb_insn_t_conflict *)node;
        if ((loop_local->parent != (loop_node_t)0x0) && (1 < *(int *)&loop_local->u)) {
          fprintf((FILE *)loop_local->parent,"  Move invariant (target bb%lu) %-5lu",
                  **(undefined8 **)((long)insn->ops[0].data + 8),
                  (ulong)*(uint *)((long)&node->bb + 4));
          print_bb_insn((gen_ctx_t)loop_local,(bb_insn_t_conflict)node,0);
        }
        gen_ctx_00 = loop_local;
        bb_insn_00 = node;
        to = *(bb_t_conflict *)((long)insn->ops[0].data + 8);
        before = DLIST_bb_insn_t_head
                           ((DLIST_bb_insn_t *)((((insn->insn_link).next)->insn_link).prev + 1));
        licm_move_insn((gen_ctx_t)gen_ctx_00,(bb_insn_t_conflict)bb_insn_00,to,before);
        var = 1;
      }
    }
    gen_ctx_local._4_4_ = var;
  }
  else {
    gen_ctx_local._4_4_ = var;
  }
  return gen_ctx_local._4_4_;
}

Assistant:

static int loop_licm (gen_ctx_t gen_ctx, loop_node_t loop) {
  MIR_insn_t insn;
  bb_insn_t bb_insn;
  loop_node_t node;
  int subloop_p = FALSE, move_p = FALSE, op_num;
  MIR_reg_t var;
  ssa_edge_t se;
  insn_var_iterator_t iter;
  bitmap_t loop_invariant_bb_insn_bitmap = temp_bitmap;
  bitmap_t bb_insns_to_move_bitmap = temp_bitmap2;
  VARR (bb_insn_t) *loop_invariant_bb_insns = temp_bb_insns;

  for (node = DLIST_HEAD (loop_node_t, loop->children); node != NULL;
       node = DLIST_NEXT (loop_node_t, node))
    if (node->bb == NULL) {
      subloop_p = TRUE;
      if (loop_licm (gen_ctx, node)) move_p = TRUE; /* process sub-loops first */
    }
  if (subloop_p || curr_cfg->root_loop_node == loop || loop->u.preheader == NULL)
    return move_p; /* e.g. root or unreachable root */
  DEBUG (2, {
    fprintf (debug_file, "Processing Loop%3lu for loop invariant motion:\n",
             (unsigned long) loop->index);
  });
  VARR_TRUNC (bb_insn_t, loop_invariant_bb_insns, 0);
  bitmap_clear (loop_invariant_bb_insn_bitmap);
  for (node = DLIST_HEAD (loop_node_t, loop->children); node != NULL;
       node = DLIST_NEXT (loop_node_t, node)) {
    if (node->bb == NULL) continue; /* skip subloops */
    for (bb_insn = DLIST_HEAD (bb_insn_t, node->bb->bb_insns); bb_insn != NULL;
         bb_insn = DLIST_NEXT (bb_insn_t, bb_insn))
      if (loop_invariant_p (gen_ctx, loop, bb_insn, NULL)) { /* Push start invariants */
        VARR_PUSH (bb_insn_t, loop_invariant_bb_insns, bb_insn);
        bitmap_set_bit_p (loop_invariant_bb_insn_bitmap, bb_insn->index);
      }
  }
  for (size_t i = 0; i < VARR_LENGTH (bb_insn_t, loop_invariant_bb_insns); i++) {
    /* Add insns becoming invariant if we move its inputs: */
    bb_insn = VARR_GET (bb_insn_t, loop_invariant_bb_insns, i);
    insn = bb_insn->insn;
    FOREACH_OUT_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
      for (se = insn->ops[op_num].data; se != NULL; se = se->next_use) {
        if (loop_invariant_p (gen_ctx, loop, se->use, loop_invariant_bb_insn_bitmap)
            && bitmap_set_bit_p (loop_invariant_bb_insn_bitmap, se->use->index))
          VARR_PUSH (bb_insn_t, loop_invariant_bb_insns, se->use);
      }
    }
  }
  bitmap_clear (bb_insns_to_move_bitmap);
  for (int i = (int) VARR_LENGTH (bb_insn_t, loop_invariant_bb_insns) - 1; i >= 0; i--) {
    bb_insn = VARR_GET (bb_insn_t, loop_invariant_bb_insns, i);
    insn = bb_insn->insn;
    DEBUG (2, {
      fprintf (debug_file, "  Considering invariant ");
      print_bb_insn (gen_ctx, bb_insn, FALSE);
    });
    if (bitmap_bit_p (bb_insns_to_move_bitmap, bb_insn->index)) {
      DEBUG (2, { fprintf (debug_file, "     -- already marked as moved\n"); });
      continue;
    }
    if (expensive_insn_p (insn)) {
      DEBUG (2, { fprintf (debug_file, "     -- marked as moved becuase it is costly\n"); });
      mark_as_moved (gen_ctx, bb_insn, loop_invariant_bb_insn_bitmap, bb_insns_to_move_bitmap);
      continue;
    }
    int can_be_moved = TRUE, input_var_p = FALSE;
    FOREACH_IN_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
      input_var_p = TRUE;
      if ((se = insn->ops[op_num].data) != NULL
          && bitmap_bit_p (loop_invariant_bb_insn_bitmap, se->def->index)
          && !bitmap_bit_p (bb_insns_to_move_bitmap, se->def->index)
          && non_invariant_use_p (gen_ctx, se->def, loop_invariant_bb_insn_bitmap)) {
        can_be_moved = FALSE;
        break;
      }
    }
    DEBUG (2, {
      if (input_var_p)
        fprintf (debug_file, "     -- %s be moved because reg presure consideration\n",
                 can_be_moved ? "can" : "can't");
      else
        fprintf (debug_file, "     -- can't be moved because single insn\n");
    });
    if (can_be_moved && input_var_p)
      mark_as_moved (gen_ctx, bb_insn, loop_invariant_bb_insn_bitmap, bb_insns_to_move_bitmap);
  }
  for (size_t i = 0; i < VARR_LENGTH (bb_insn_t, loop_invariant_bb_insns); i++) {
    bb_insn = VARR_GET (bb_insn_t, loop_invariant_bb_insns, i);
    if (!bitmap_bit_p (bb_insns_to_move_bitmap, bb_insn->index)) continue;
    insn = bb_insn->insn;
    DEBUG (2, {
      fprintf (debug_file, "  Move invariant (target bb%lu) %-5lu",
               (unsigned long) loop->u.preheader->bb->index, (unsigned long) bb_insn->index);
      print_bb_insn (gen_ctx, bb_insn, FALSE);
    });
    licm_move_insn (gen_ctx, bb_insn, loop->u.preheader->bb,
                    DLIST_HEAD (bb_insn_t, loop->entry->bb->bb_insns));
    move_p = TRUE;
  }
  return move_p;
}